

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O3

void __thiscall
Privkey_Privkey_HexString_Error_Test::~Privkey_Privkey_HexString_Error_Test
          (Privkey_Privkey_HexString_Error_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Privkey, Privkey_HexString_Error) {
  try {
    std::string hex =
        "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f2701";
    Privkey privkey(hex);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "Invalid Privkey data.");
    return;
  }
  ASSERT_TRUE(false);
}